

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::ReplaceChild
          (TiXmlNode *this,TiXmlNode *replaceThis,TiXmlNode *withThis)

{
  int iVar1;
  undefined4 extraout_var;
  TiXmlNode **ppTVar3;
  TiXmlNode *pTVar2;
  
  if (replaceThis->parent == this) {
    iVar1 = (*(withThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])(withThis);
    pTVar2 = (TiXmlNode *)CONCAT44(extraout_var,iVar1);
    if (pTVar2 != (TiXmlNode *)0x0) {
      pTVar2->next = replaceThis->next;
      pTVar2->prev = replaceThis->prev;
      ppTVar3 = &replaceThis->next->prev;
      if (replaceThis->next == (TiXmlNode *)0x0) {
        ppTVar3 = &this->lastChild;
      }
      *ppTVar3 = pTVar2;
      ppTVar3 = &replaceThis->prev->next;
      if (replaceThis->prev == (TiXmlNode *)0x0) {
        ppTVar3 = &this->firstChild;
      }
      *ppTVar3 = pTVar2;
      if (replaceThis != (TiXmlNode *)0x0) {
        (*(replaceThis->super_TiXmlBase)._vptr_TiXmlBase[1])(replaceThis);
      }
      pTVar2->parent = this;
      return pTVar2;
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::ReplaceChild(TiXmlNode* replaceThis,
	const TiXmlNode& withThis) {
	if (replaceThis->parent != this)
		return 0;

	TiXmlNode* node = withThis.Clone();
	if (!node)
		return 0;

	node->next = replaceThis->next;
	node->prev = replaceThis->prev;

	if (replaceThis->next)
		replaceThis->next->prev = node;
	else
		lastChild = node;

	if (replaceThis->prev)
		replaceThis->prev->next = node;
	else
		firstChild = node;

	delete replaceThis;
	node->parent = this;
	return node;
}